

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O0

lua_Unsigned project(lua_Unsigned ran,lua_Unsigned n,RanState *state)

{
  byte bVar1;
  byte bVar2;
  lua_Unsigned lStack_28;
  int sh;
  lua_Unsigned lim;
  RanState *state_local;
  lua_Unsigned n_local;
  lua_Unsigned ran_local;
  
  bVar2 = 1;
  for (lStack_28 = n; n_local = ran, (lStack_28 & lStack_28 + 1) != 0;
      lStack_28 = lStack_28 >> bVar1 | lStack_28) {
    bVar1 = bVar2 & 0x3f;
    bVar2 = bVar2 << 1;
  }
  while (n < (lStack_28 & n_local)) {
    n_local = nextrand(state->s);
  }
  return lStack_28 & n_local;
}

Assistant:

static lua_Unsigned project (lua_Unsigned ran, lua_Unsigned n,
                             RanState *state) {
  lua_Unsigned lim = n;  /* to compute the Mersenne number */
  int sh;  /* how much to spread bits to the right in 'lim' */
  /* spread '1' bits in 'lim' until it becomes a Mersenne number */
  for (sh = 1; (lim & (lim + 1)) != 0; sh *= 2)
    lim |= (lim >> sh);  /* spread '1's to the right */
  while ((ran &= lim) > n)  /* project 'ran' into [0..lim] and test */
    ran = I2UInt(nextrand(state->s));  /* not inside [0..n]? try again */
  return ran;
}